

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  time_t tVar3;
  Map *this;
  Render *this_00;
  char *caption;
  
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  this = (Map *)operator_new(0xe70);
  Map::Map(this);
  this_00 = (Render *)operator_new(0x3f8);
  Render::Render(this_00,this);
  do {
    Map::setPalette(this,'\0','\x01',true);
    bVar1 = Map::loadMap(this,"res/levels.txt");
    if (!bVar1) {
      puts("[ERROR]\tCannot open level file");
      return -1;
    }
    iVar2 = gameLoop(this,this_00);
    caption = "Przegrales. Grasz jeszcze raz?";
    if (iVar2 != 2) {
      if (iVar2 != 3) {
        return 0;
      }
      caption = "To byl ostatni poziom. Grasz od poczatku?";
    }
    bVar1 = Render::dialogYesNo(this_00,caption);
  } while (bVar1);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
    srand(time(nullptr));
    Map *map = new Map();
    Render *render = new Render(map);
    bool newGame = true;
    while(newGame){
        map->setPalette(PALETTE_DEFAULT, PALETTE_SMALL, true);
        if(!map->loadMap(LEVEL_FILE)){
            printf("[ERROR]\tCannot open level file\n");
            return -1;
        }
        switch(gameLoop(map, render)){
            default:
                return 0;
            case GAME_OVER:
                if(!render->dialogYesNo("Przegrales. Grasz jeszcze raz?")) {
                    newGame = false;
                } else{
                    newGame = true;
                }
                break;
            case GAME_END:
                if(!render->dialogYesNo("To byl ostatni poziom. Grasz od poczatku?")) {
                    newGame = false;
                } else{
                    newGame = true;
                }
                break;
        }
    }
    return 0;
}